

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tes2CapabilityTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::ExtensionTests::init()::ExtGroup::ExtGroup(deqp::gles2::
TestCaseGroup__char_const__char_const__(void *this,TestCaseGroup *parent,char *name,char *desc)

{
  Context *this_00;
  ContextInfo *pCVar1;
  TestCaseGroup *this_01;
  TestContext *testCtx;
  char *desc_local;
  char *name_local;
  TestCaseGroup *parent_local;
  ExtGroup *this_local;
  
  *(undefined8 *)this = 0;
  this_00 = TestCaseGroup::getContext(parent);
  pCVar1 = gles2::Context::getContextInfo(this_00);
  *(ContextInfo **)((long)this + 8) = pCVar1;
  this_01 = (TestCaseGroup *)operator_new(0x70);
  testCtx = tcu::TestNode::getTestContext((TestNode *)parent);
  tcu::TestCaseGroup::TestCaseGroup(this_01,testCtx,name,desc);
  *(TestCaseGroup **)this = this_01;
  tcu::TestNode::addChild((TestNode *)parent,*this);
  return;
}

Assistant:

ExtGroup (TestCaseGroup* parent, const char* name, const char* desc)
				: group		(DE_NULL)
				, ctxInfo	(parent->getContext().getContextInfo())
			{
				group = new tcu::TestCaseGroup(parent->getTestContext(), name, desc);
				parent->addChild(group);
			}